

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPLayer.cpp
# Opt level: O0

void __thiscall TCPLayer::notifyWrite(TCPLayer *this)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  char *pcVar4;
  ssize_t sVar5;
  unsigned_long uVar6;
  size_t in_RCX;
  int in_R8D;
  int sentBytes_1;
  undefined1 local_30 [8];
  Buffer packet;
  int sentBytes;
  TCPLayer *this_local;
  
  iVar1 = Buffer::getSize(&this->outgoingPacket);
  if (iVar1 < 1) {
    uVar6 = SynchronizedQueue<Buffer>::getSize(&this->packetsToSend);
    if (uVar6 != 0) {
      SynchronizedQueue<Buffer>::get((Buffer *)local_30,&this->packetsToSend);
      uVar3 = Buffer::getSize((Buffer *)local_30);
      uVar3 = htonl(uVar3);
      Buffer::append(&this->outgoingPacket,uVar3);
      pcVar4 = Buffer::getData((Buffer *)local_30);
      iVar1 = Buffer::getSize((Buffer *)local_30);
      Buffer::append(&this->outgoingPacket,pcVar4,(long)iVar1);
      pcVar4 = Buffer::getData(&this->outgoingPacket);
      uVar2 = Buffer::getSize(&this->outgoingPacket);
      sVar5 = TCPSocket::send(&this->socket,(int)pcVar4,(void *)(ulong)uVar2,in_RCX,in_R8D);
      Buffer::consume(&this->outgoingPacket,(long)(int)sVar5);
      Buffer::~Buffer((Buffer *)local_30);
    }
  }
  else {
    pcVar4 = Buffer::getData(&this->outgoingPacket);
    uVar2 = Buffer::getSize(&this->outgoingPacket);
    sVar5 = TCPSocket::send(&this->socket,(int)pcVar4,(void *)(ulong)uVar2,in_RCX,in_R8D);
    packet.data.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = SUB84(sVar5,0);
    Buffer::consume(&this->outgoingPacket,
                    (long)(int)packet.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               _20_4_);
  }
  return;
}

Assistant:

void TCPLayer::notifyWrite() {
    if(outgoingPacket.getSize() > 0){
        int sentBytes = socket.send(outgoingPacket.getData(), outgoingPacket.getSize());
        outgoingPacket.consume(sentBytes);
    }
    else{
        if(packetsToSend.getSize() > 0){
            auto packet = packetsToSend.get();
            outgoingPacket.append(::htonl(packet.getSize()));
            outgoingPacket.append(packet.getData(), packet.getSize());

            int sentBytes = socket.send(outgoingPacket.getData(), outgoingPacket.getSize());
            outgoingPacket.consume(sentBytes);
        }
    }
}